

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

lysc_node *
lysc_ext_find_node(lysc_ext_instance *ext,lys_module *module,char *name,size_t name_len,
                  uint16_t nodetype,uint32_t options)

{
  int iVar1;
  lysc_node *last;
  char *pcVar2;
  
  if (ext == (lysc_ext_instance *)0x0) {
    pcVar2 = "ext";
  }
  else {
    if (name != (char *)0x0) {
      if ((module != (lys_module *)0x0) && (ext->module != module)) {
        return (lysc_node *)0x0;
      }
      last = lys_getnext_((lysc_node *)0x0,(lysc_node *)0x0,(lysc_module *)0x0,ext,options);
      if (last == (lysc_node *)0x0) {
        return (lysc_node *)0x0;
      }
      do {
        if ((last->nodetype & (-(ushort)(nodetype == 0) | nodetype)) != 0) {
          if (name_len == 0) {
            iVar1 = strcmp(last->name,name);
          }
          else {
            iVar1 = ly_strncmp(last->name,name,name_len);
          }
          if (iVar1 == 0) {
            return last;
          }
        }
        last = lys_getnext_(last,(lysc_node *)0x0,(lysc_module *)0x0,ext,options);
        if (last == (lysc_node *)0x0) {
          return (lysc_node *)0x0;
        }
      } while( true );
    }
    pcVar2 = "name";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"lysc_ext_find_node")
  ;
  return (lysc_node *)0x0;
}

Assistant:

const struct lysc_node *
lysc_ext_find_node(const struct lysc_ext_instance *ext, const struct lys_module *module, const char *name, size_t name_len,
        uint16_t nodetype, uint32_t options)
{
    const struct lysc_node *node = NULL;

    LY_CHECK_ARG_RET(NULL, ext, name, NULL);
    if (!nodetype) {
        nodetype = LYS_NODETYPE_MASK;
    }

    if (module && (module != ext->module)) {
        return NULL;
    }

    while ((node = lys_getnext_ext(node, NULL, ext, options))) {
        if (!(node->nodetype & nodetype)) {
            continue;
        }

        if (name_len) {
            if (!ly_strncmp(node->name, name, name_len)) {
                return node;
            }
        } else {
            if (!strcmp(node->name, name)) {
                return node;
            }
        }
    }
    return NULL;
}